

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStore.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     xlat<unsigned_short,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,Context *context)

{
  Segments *pSVar1;
  byte bVar2;
  
  bVar2 = (byte)(instruction->source_data_dest_sib_ >> 10) & 7 | 8;
  pSVar1 = (context->memory).segments_;
  if (bVar2 != 8) {
    if (bVar2 == 9) {
      pSVar1 = (Segments *)&pSVar1->cs_base_;
    }
    else if (bVar2 == 10) {
      pSVar1 = (Segments *)&pSVar1->ss_base_;
    }
    else {
      pSVar1 = (Segments *)&pSVar1->ds_base_;
    }
  }
  (context->registers).ax_.halves.low =
       (context->memory).memory._M_elems
       [(uint)(ushort)((ushort)(context->registers).ax_.halves.low + (context->registers).bx_.full)
        + pSVar1->es_base_ & 0xfffff];
  return;
}

Assistant:

void xlat(
	const InstructionT &instruction,
	ContextT &context
) {
	AddressT address;
	if constexpr (std::is_same_v<AddressT, uint16_t>) {
		address = context.registers.bx() + context.registers.al();
	}

	context.registers.al() = context.memory.template access<uint8_t, AccessType::Read>(instruction.data_segment(), address);
}